

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void slang::ast::Lookup::name
               (NameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  int iVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view name_00;
  SourceRange range;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts;
  optional<slang::SourceRange> range_00;
  optional<slang::SourceRange> range_01;
  string_view name_01;
  bool bVar2;
  Symbol *pSVar3;
  SystemNameSyntax *pSVar4;
  SystemSubroutine *pSVar5;
  RootSymbol *pRVar6;
  CompilationUnitSymbol *pCVar7;
  Type *pTVar8;
  LookupResult *in_RCX;
  undefined4 in_EDX;
  SourceLocation in_RDI;
  LookupLocation LVar9;
  SourceRange SVar10;
  GenericClassDefSymbol *classDef;
  Diagnostic *diag;
  Token tok_1;
  Token tok;
  Scope *in_stack_000002d8;
  bitmask<slang::ast::LookupFlags> in_stack_000002e4;
  LookupLocation in_stack_000002e8;
  string_view in_stack_000002f8;
  KnownSystemName knownNameId;
  Token nameToken;
  LookupResult *in_stack_00000390;
  ASTContext *in_stack_00000398;
  NameComponents name;
  Scope *scope;
  _Optional_payload_base<slang::SourceRange> in_stack_00000790;
  SymbolIndex in_stack_000007a8;
  LookupResult *in_stack_000007b0;
  Scope *in_stack_000007b8;
  SyntaxNode *in_stack_000007c0;
  SourceRange *in_stack_fffffffffffffbe8;
  KnownSystemName knownNameId_00;
  SourceRange *__t;
  Compilation *in_stack_fffffffffffffbf0;
  LookupResult *this;
  Scope *in_stack_fffffffffffffbf8;
  SourceLocation noteLocation;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 uVar11;
  DiagCode in_stack_fffffffffffffc04;
  SourceLocation in_stack_fffffffffffffc08;
  LookupResult *this_00;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 uVar12;
  DiagCode in_stack_fffffffffffffc14;
  undefined4 uVar13;
  SourceLocation in_stack_fffffffffffffc18;
  SourceLocation syntax_00;
  undefined4 in_stack_fffffffffffffc20;
  DiagCode in_stack_fffffffffffffc24;
  GenericClassDefSymbol *in_stack_fffffffffffffc28;
  Scope *pSVar14;
  LookupResult *in_stack_fffffffffffffc30;
  Compilation *in_stack_fffffffffffffc38;
  Scope *in_stack_fffffffffffffc40;
  Scope *this_01;
  SourceLocation in_stack_fffffffffffffc48;
  SourceLocation in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  bitmask<slang::ast::LookupFlags> flags_00;
  NameSyntax *in_stack_fffffffffffffc68;
  NameComponents *in_stack_fffffffffffffc70;
  bitmask<slang::ast::LookupFlags> local_33c;
  undefined8 local_338;
  undefined8 local_330;
  Symbol *in_stack_fffffffffffffce8;
  LookupResult *in_stack_fffffffffffffcf0;
  LookupResult *pLVar15;
  ASTContext *in_stack_fffffffffffffcf8;
  __extent_storage<18446744073709551615UL> _Var16;
  NameComponents *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  bitmask<slang::ast::LookupFlags> flags_01;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd18;
  bitmask<slang::ast::LookupFlags> local_278;
  undefined4 local_274;
  SourceRange *local_270;
  LookupResult *local_268;
  SourceLocation local_260;
  LookupResult *local_258;
  uint32_t local_250;
  undefined1 in_stack_fffffffffffffdb7;
  LookupResult *in_stack_fffffffffffffdb8;
  LookupResult *result_00;
  undefined4 in_stack_fffffffffffffdc0;
  uint32_t uVar17;
  undefined4 in_stack_fffffffffffffdc4;
  undefined8 in_stack_fffffffffffffdd0;
  char *pcVar18;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  string_view local_1d8;
  SourceLocation local_1c8;
  SourceLocation local_1c0;
  undefined4 local_1b4;
  Token local_1b0;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 in_stack_fffffffffffffe68 [16];
  basic_string_view<char,_std::char_traits<char>_> in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  LookupResult *local_160;
  bitmask<slang::ast::LookupFlags> local_14c;
  string_view local_148;
  SourceRange local_138;
  undefined4 local_124;
  string_view local_120;
  KnownSystemName local_10c;
  undefined8 local_108;
  Info *local_100;
  SourceRange local_f8;
  undefined4 local_e8;
  bitmask<slang::ast::LookupFlags> local_e4;
  SourceRange local_e0;
  bitmask<slang::ast::LookupFlags> *local_d0;
  bitmask<slang::ast::LookupFlags> *local_c8;
  undefined4 local_b4;
  undefined1 local_b0 [56];
  basic_string_view<char,_std::char_traits<char>_> local_78 [2];
  undefined8 local_58;
  undefined8 local_50;
  long local_48;
  Scope *local_40;
  LookupResult *local_38;
  SourceLocation local_28;
  undefined4 local_1c;
  
  flags_01.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_38 = in_RCX;
  local_28 = in_RDI;
  local_1c = in_EDX;
  pLVar15 = local_160;
  local_40 = not_null<const_slang::ast::Scope_*>::operator*
                       ((not_null<const_slang::ast::Scope_*> *)0x475ab7);
  anon_unknown_39::NameComponents::NameComponents((NameComponents *)in_stack_fffffffffffffbf0);
  iVar1 = *(int *)local_28;
  if ((1 < iVar1 - 0x17U) && (1 < iVar1 - 0x1aU)) {
    if (iVar1 != 0x4b) {
      if (iVar1 == 0x67) {
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40);
        SVar10.startLoc._4_2_ = in_stack_fffffffffffffc14.subsystem;
        SVar10.startLoc._6_2_ = in_stack_fffffffffffffc14.code;
        SVar10.startLoc._0_4_ = in_stack_fffffffffffffc10;
        SVar10.endLoc = in_stack_fffffffffffffc18;
        LookupResult::addDiag
                  ((LookupResult *)in_stack_fffffffffffffc08,
                   (Scope *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   in_stack_fffffffffffffc24,SVar10);
        slang::syntax::SyntaxNode::getFirstToken
                  ((SyntaxNode *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
        parsing::Token::valueText
                  ((Token *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
        arg_02._M_str = (char *)in_stack_fffffffffffffc40;
        arg_02._M_len = (size_t)in_stack_fffffffffffffc38;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc30,arg_02);
        (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_38->found)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        return;
      }
      if (1 < iVar1 - 0xe5U) {
        if (iVar1 == 0x112) {
          (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             *)&local_38->found)->
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          return;
        }
        if (iVar1 == 0x196) {
          bitmask<slang::ast::LookupFlags>::bitmask(&local_14c,AllowRoot);
          bVar2 = bitmask<slang::ast::LookupFlags>::has
                            ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffbf0,
                             (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffbe8);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            Scope::getCompilation(local_40);
            pRVar6 = Compilation::getRoot((Compilation *)0x476060);
            (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)&local_38->found)->
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)pRVar6;
            return;
          }
          _local_160 = slang::syntax::SyntaxNode::getFirstToken
                                 ((SyntaxNode *)
                                  CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          parsing::Token::location((Token *)&local_160);
          parsing::Token::valueText
                    ((Token *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe78);
          SourceLocation::operator+<unsigned_long>
                    ((SourceLocation *)in_stack_fffffffffffffbf8,
                     (unsigned_long)in_stack_fffffffffffffbf0);
          LookupResult::addDiag
                    ((LookupResult *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     in_stack_fffffffffffffbf8,in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
          sv((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8);
          arg_00._M_str = (char *)in_stack_fffffffffffffc40;
          arg_00._M_len = (size_t)in_stack_fffffffffffffc38;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc30,arg_00);
          return;
        }
        if (iVar1 == 0x1a1) {
          slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>((SyntaxNode *)local_28);
          local_b4 = local_1c;
          qualified((ScopedNameSyntax *)name.text._M_len,in_stack_00000398,name.text._M_str._4_4_,
                    in_stack_00000390);
          local_e0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40)
          ;
          std::optional<slang::SourceRange>::optional<slang::SourceRange,_true>
                    ((optional<slang::SourceRange> *)in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffbe8);
          range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
               (SourceLocation)in_stack_fffffffffffffdd8;
          range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
               (SourceLocation)in_stack_fffffffffffffdd0;
          range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._16_8_ = in_stack_fffffffffffffde0;
          anon_unknown_39::unwrapResult
                    ((Scope *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),range_00
                     ,in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7);
          bitmask<slang::ast::LookupFlags>::bitmask(&local_e4,NoSelectors);
          bVar2 = bitmask<slang::ast::LookupFlags>::has(local_c8,local_d0);
          if (!bVar2) {
            return;
          }
          LookupResult::errorIfSelectors
                    (in_stack_fffffffffffffc30,(ASTContext *)in_stack_fffffffffffffc28);
          return;
        }
        if (iVar1 != 0x1c5) {
          if (iVar1 == 0x1c7) {
            pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::SystemNameSyntax>
                               ((SyntaxNode *)local_28);
            knownNameId_00 = (KnownSystemName)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
            local_108._0_2_ = (pSVar4->systemIdentifier).kind;
            local_108._2_1_ = (pSVar4->systemIdentifier).field_0x2;
            local_108._3_1_ = (pSVar4->systemIdentifier).numFlags;
            local_108._4_4_ = (pSVar4->systemIdentifier).rawLen;
            local_100 = (pSVar4->systemIdentifier).info;
            (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)&local_38->found)->
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_10c = parsing::Token::systemName((Token *)in_stack_fffffffffffffbf0);
            if (local_10c == Unknown) {
              Scope::getCompilation(local_40);
              local_120 = parsing::Token::valueText
                                    ((Token *)CONCAT44(in_stack_fffffffffffffc04,
                                                       in_stack_fffffffffffffc00));
              name_00._M_str = (char *)in_stack_fffffffffffffc48;
              name_00._M_len = (size_t)in_stack_fffffffffffffc40;
              pSVar5 = Compilation::getSystemSubroutine(in_stack_fffffffffffffc38,name_00);
              local_38->systemSubroutine = pSVar5;
            }
            else {
              Scope::getCompilation(local_40);
              pSVar5 = Compilation::getSystemSubroutine(in_stack_fffffffffffffbf0,knownNameId_00);
              local_38->systemSubroutine = pSVar5;
            }
            if (local_38->systemSubroutine != (SystemSubroutine *)0x0) {
              return;
            }
            local_124 = 0x42000a;
            local_138 = parsing::Token::range
                                  ((Token *)CONCAT44(in_stack_fffffffffffffc14,
                                                     in_stack_fffffffffffffc10));
            sourceRange.startLoc._4_2_ = in_stack_fffffffffffffc14.subsystem;
            sourceRange.startLoc._6_2_ = in_stack_fffffffffffffc14.code;
            sourceRange.startLoc._0_4_ = in_stack_fffffffffffffc10;
            sourceRange.endLoc = in_stack_fffffffffffffc18;
            LookupResult::addDiag
                      ((LookupResult *)in_stack_fffffffffffffc08,
                       (Scope *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                       in_stack_fffffffffffffc24,sourceRange);
            local_148 = parsing::Token::valueText
                                  ((Token *)CONCAT44(in_stack_fffffffffffffc04,
                                                     in_stack_fffffffffffffc00));
            arg._M_str = (char *)in_stack_fffffffffffffc40;
            arg._M_len = (size_t)in_stack_fffffffffffffc38;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc30,arg);
            return;
          }
          if (iVar1 == 0x1cc) {
            local_e8 = local_1c;
            local_f8 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)in_stack_fffffffffffffc40);
            range.endLoc = in_stack_fffffffffffffc50;
            range.startLoc = in_stack_fffffffffffffc48;
            pSVar3 = anon_unknown_39::findThisHandle
                               (in_stack_fffffffffffffc40,flags_00,range,
                                (LookupResult *)in_stack_fffffffffffffc38);
            (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)&local_38->found)->
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar3;
            return;
          }
          bitmask<slang::ast::LookupFlags>::bitmask
                    ((bitmask<slang::ast::LookupFlags> *)&stack0xfffffffffffffe64,AllowUnit);
          bVar2 = bitmask<slang::ast::LookupFlags>::has
                            ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffbf0,
                             (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffbe8);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pCVar7 = Scope::getCompilationUnit(in_stack_fffffffffffffbf8);
            (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)&local_38->found)->
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar7;
            return;
          }
          local_1b0 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)
                                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          local_1b4 = 0x550005;
          local_1c8 = parsing::Token::location(&local_1b0);
          local_1d8 = parsing::Token::valueText
                                ((Token *)CONCAT44(in_stack_fffffffffffffc04,
                                                   in_stack_fffffffffffffc00));
          std::basic_string_view<char,_std::char_traits<char>_>::length(&local_1d8);
          local_1c0 = SourceLocation::operator+<unsigned_long>
                                ((SourceLocation *)in_stack_fffffffffffffbf8,
                                 (unsigned_long)in_stack_fffffffffffffbf0);
          LookupResult::addDiag
                    ((LookupResult *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     in_stack_fffffffffffffbf8,in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
          sv((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8);
          arg_01._M_str = (char *)in_stack_fffffffffffffc40;
          arg_01._M_len = (size_t)in_stack_fffffffffffffc38;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc30,arg_01);
          return;
        }
        goto LAB_004762bc;
      }
    }
    anon_unknown_39::NameComponents::NameComponents
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    memcpy(local_78,local_b0,0x38);
  }
LAB_004762bc:
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_78);
  if (!bVar2) {
    this_01 = local_40;
    LVar9 = ASTContext::getLocation((ASTContext *)in_stack_fffffffffffffbf0);
    local_258 = (LookupResult *)LVar9.scope;
    local_250 = LVar9.index;
    result_00 = local_258;
    uVar17 = local_250;
    std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
              ((optional<slang::SourceRange> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    local_274 = local_1c;
    uVar11 = 0;
    uVar12 = SUB84(local_40,0);
    uVar13 = (undefined4)((ulong)local_40 >> 0x20);
    this_00 = local_38;
    unqualifiedImpl(in_stack_000002d8,in_stack_000002f8,in_stack_000002e8,
                    (optional<slang::SourceRange>)in_stack_00000790,in_stack_000002e4,
                    in_stack_000007a8,in_stack_000007b0,in_stack_000007b8,in_stack_000007c0);
    __t = local_270;
    this = local_268;
    noteLocation = local_260;
    syntax_00 = local_28;
    pcVar18 = local_78[0]._M_str;
    if ((((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_38->found)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      bitmask<slang::ast::LookupFlags>::bitmask(&local_278,AlwaysAllowUpward);
      bVar2 = bitmask<slang::ast::LookupFlags>::has
                        ((bitmask<slang::ast::LookupFlags> *)local_268,
                         (bitmask<slang::ast::LookupFlags> *)local_270);
      __t = local_270;
      this = local_268;
      noteLocation = local_260;
      syntax_00 = local_28;
      pcVar18 = local_78[0]._M_str;
      if (bVar2) {
        std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
        span((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *)
             0x476422);
        nameParts._M_ptr._4_4_ = in_stack_fffffffffffffd14;
        nameParts._M_ptr._0_4_ = in_stack_fffffffffffffd10;
        nameParts._M_extent._M_extent_value = in_stack_fffffffffffffd18._M_extent_value;
        bVar2 = anon_unknown_39::lookupUpward
                          (nameParts,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,flags_01,
                           in_stack_fffffffffffffcf0);
        __t = local_270;
        this = local_268;
        noteLocation = local_260;
        syntax_00 = local_28;
        pcVar18 = local_78[0]._M_str;
        if (!bVar2) {
          return;
        }
      }
      if (((((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              *)&local_38->found)->
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) &&
         (bVar2 = LookupResult::hasError((LookupResult *)in_stack_fffffffffffffc28), !bVar2)) {
        __t = (SourceRange *)((ulong)__t & 0xffffffff00000000);
        name_01._M_str = in_stack_fffffffffffffe90;
        name_01._M_len = in_stack_fffffffffffffe88;
        this = local_38;
        reportUndeclared(in_stack_fffffffffffffe68._0_8_,name_01,
                         (SourceRange)in_stack_fffffffffffffe78,
                         (bitmask<slang::ast::LookupFlags>)in_stack_fffffffffffffe68._12_4_,
                         (bool)in_stack_fffffffffffffe67,pLVar15);
      }
    }
    if (((((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            *)&local_38->found)->
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) && (local_48 != 0)) {
      if (*(int *)&(((((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        *)&local_38->found)->
                     super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                   ).
                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
          == 0x43) {
        Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)0x47667b);
        pTVar8 = GenericClassDefSymbol::getSpecialization
                           (in_stack_fffffffffffffc28,
                            (ASTContext *)
                            CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                            (ParameterValueAssignmentSyntax *)syntax_00);
        (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_38->found)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar8;
      }
      else {
        in_stack_fffffffffffffc30 = local_38;
        pSVar14 = local_40;
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_01);
        sourceRange_00.startLoc._4_4_ = uVar13;
        sourceRange_00.startLoc._0_4_ = uVar12;
        sourceRange_00.endLoc = syntax_00;
        LookupResult::addDiag
                  (this_00,(Scope *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                   in_stack_fffffffffffffc24,sourceRange_00);
        arg_03._M_str = (char *)this_01;
        arg_03._M_len = (size_t)pSVar14;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc30,arg_03);
        Diagnostic::addNote((Diagnostic *)this,in_stack_fffffffffffffc04,noteLocation);
        (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_38->found)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    pSVar14 = local_40;
    SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_01);
    std::optional<slang::SourceRange>::optional<slang::SourceRange,_true>
              ((optional<slang::SourceRange> *)this,__t);
    range_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
         (SourceLocation)in_stack_fffffffffffffdd8;
    range_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
         (SourceLocation)pcVar18;
    range_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._16_8_ = in_stack_fffffffffffffde0;
    pSVar3 = in_stack_fffffffffffffce8;
    pLVar15 = in_stack_fffffffffffffcf0;
    _Var16._M_extent_value = (size_t)in_stack_fffffffffffffcf8;
    anon_unknown_39::unwrapResult
              ((Scope *)CONCAT44(in_stack_fffffffffffffdc4,uVar17),range_01,result_00,
               (bool)in_stack_fffffffffffffdb7);
    bVar2 = std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::
            empty((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
                  0x476738);
    if (!bVar2) {
      if ((((((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               *)&local_38->found)->
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
          (bVar2 = Symbol::isScope((Symbol *)0x476762), !bVar2)) ||
         (bVar2 = Symbol::isType((Symbol *)0x476778), bVar2)) {
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::
        append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                  ((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                   (span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
                   in_stack_fffffffffffffcf8);
        bitmask<slang::ast::LookupFlags>::bitmask(&local_33c,NoSelectors);
        bVar2 = bitmask<slang::ast::LookupFlags>::has
                          ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffcf0,
                           (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffce8);
        if (bVar2) {
          LookupResult::errorIfSelectors(in_stack_fffffffffffffc30,(ASTContext *)pSVar14);
        }
      }
      else {
        local_338 = local_58;
        local_330 = local_50;
        selectors._M_extent._M_extent_value = _Var16._M_extent_value;
        selectors._M_ptr = (pointer)pLVar15;
        pSVar3 = selectChild(pSVar3,selectors,(ASTContext *)SVar10.endLoc,
                             (LookupResult *)SVar10.startLoc);
        (((vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           *)&local_38->found)->
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar3;
      }
    }
  }
  return;
}

Assistant:

void Lookup::name(const NameSyntax& syntax, const ASTContext& context, bitmask<LookupFlags> flags,
                  LookupResult& result) {
    auto& scope = *context.scope;
    NameComponents name;
    switch (syntax.kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = syntax;
            break;
        case SyntaxKind::ScopedName:
            // Handle qualified names separately.
            qualified(syntax.as<ScopedNameSyntax>(), context, flags, result);
            unwrapResult(scope, syntax.sourceRange(), result);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, syntax.sourceRange(), result);
            return;
        case SyntaxKind::SystemName: {
            // If this is a system name, look up directly in the compilation.
            Token nameToken = syntax.as<SystemNameSyntax>().systemIdentifier;
            result.found = nullptr;

            if (auto knownNameId = nameToken.systemName();
                knownNameId != KnownSystemName::Unknown) {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(knownNameId);
            }
            else {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(
                    nameToken.valueText());
            }

            if (!result.systemSubroutine) {
                result.addDiag(scope, diag::UnknownSystemName, nameToken.range())
                    << nameToken.valueText();
            }
            return;
        }
        case SyntaxKind::RootScope:
            if (!flags.has(LookupFlags::AllowRoot)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "."sv;
                return;
            }
            result.found = &scope.getCompilation().getRoot();
            return;
        case SyntaxKind::UnitScope:
            if (!flags.has(LookupFlags::AllowUnit)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "::"sv;
                return;
            }
            result.found = scope.getCompilationUnit();
            return;
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, syntax.sourceRange())
                << syntax.getFirstToken().valueText();
            result.found = nullptr;
            return;
        case SyntaxKind::LocalScope:
            // This can only happen in error scenarios, where the parser has
            // already issued a diagnostic.
            result.found = nullptr;
            return;
        case SyntaxKind::SuperHandle:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
            // These error cases can't happen here because the parser will always
            // wrap them into a scoped name.
        default:
            SLANG_UNREACHABLE;
    }

    // If the parser added a missing identifier token, it already issued an appropriate error.
    if (name.text.empty())
        return;

    // Perform the lookup.
    unqualifiedImpl(scope, name.text, context.getLocation(), name.range, flags, {}, result, scope,
                    &syntax);

    if (!result.found) {
        if (flags.has(LookupFlags::AlwaysAllowUpward)) {
            if (!lookupUpward({}, name, context, flags, result))
                return;
        }

        if (!result.found && !result.hasError())
            reportUndeclared(scope, name.text, name.range, flags, false, result);
    }

    if (result.found && name.paramAssignments) {
        if (result.found->kind != SymbolKind::GenericClassDef) {
            auto& diag = result.addDiag(scope, diag::NotAGenericClass, syntax.sourceRange());
            diag << result.found->name;
            diag.addNote(diag::NoteDeclarationHere, result.found->location);

            result.found = nullptr;
        }
        else {
            auto& classDef = result.found->as<GenericClassDefSymbol>();
            result.found = &classDef.getSpecialization(context, *name.paramAssignments);
        }
    }

    unwrapResult(scope, syntax.sourceRange(), result);

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType()) {
            result.found = selectChild(*result.found, name.selectors, context, result);
        }
        else {
            result.selectors.append_range(name.selectors);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
        }
    }
}